

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stubs.h
# Opt level: O2

uint64_t getms(void)

{
  uint64_t uVar1;
  timeval local_28;
  
  if (getms::epoch == 0) {
    getms::epoch = time((time_t *)0x0);
  }
  uVar1 = 0;
  gettimeofday(&local_28,(__timezone_ptr_t)0x0);
  if (getms::epoch <= local_28.tv_sec) {
    uVar1 = local_28.tv_usec / 1000 + (local_28.tv_sec - getms::epoch) * 1000;
  }
  return uVar1;
}

Assistant:

uint64_t
getms(void)
{
#ifdef _WIN32
	return (GetTickCount64());
#else
	static time_t  epoch;
	struct timeval tv;

	if (epoch == 0) {
		epoch = time(NULL);
	}
	gettimeofday(&tv, NULL);

	if (tv.tv_sec < epoch) {
		// Broken clock.
		// This will force all other timing tests to fail
		return (0);
	}
	tv.tv_sec -= epoch;
	return (
	    ((uint64_t)(tv.tv_sec) * 1000) + (uint64_t)(tv.tv_usec / 1000));
#endif
}